

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

void __thiscall
cmLinkLineComputer::ComputeLinkLibraries
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  ostream *poVar1;
  string_view str;
  string remainingLibs;
  string rpath_link;
  string rpath;
  ostringstream fout;
  ostringstream rpathOut;
  string local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  ostream local_310;
  ostream local_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  ComputeRPath_abi_cxx11_((string *)&local_310,this,cli);
  std::operator<<(&local_198,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::stringbuf::str();
  if (local_330._M_string_length != 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkLibraries,&local_330);
  }
  ComputeLinkLibs(this,cli,linkLibraries);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&local_350,cli);
  if (((cli->RPathLinkFlag)._M_string_length != 0) && (local_350._M_string_length != 0)) {
    std::operator<<(&local_310,(string *)&cli->RPathLinkFlag);
    str._M_str = local_350._M_dataplus._M_p;
    str._M_len = local_350._M_string_length;
    cmOutputConverter::EscapeForShell_abi_cxx11_
              (&local_370,this->OutputConverter,str,(bool)(this->ForResponse ^ 1),false,false,false,
               false);
    std::operator<<(&local_310,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::operator<<(&local_310," ");
  }
  if (stdLibString->_M_string_length != 0) {
    poVar1 = std::operator<<(&local_310,(string *)stdLibString);
    std::operator<<(poVar1," ");
  }
  std::__cxx11::stringbuf::str();
  if (local_370._M_string_length != 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string&>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkLibraries,&local_370);
  }
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  std::ostringstream rpathOut;
  rpathOut << this->ComputeRPath(cli);

  std::string rpath = rpathOut.str();
  if (!rpath.empty()) {
    linkLibraries.emplace_back(std::move(rpath));
  }

  // Write the library flags to the build rule.
  this->ComputeLinkLibs(cli, linkLibraries);

  // Add the linker runtime search path if any.
  std::ostringstream fout;
  std::string rpath_link = cli.GetRPathLinkString();
  if (!cli.GetRPathLinkFlag().empty() && !rpath_link.empty()) {
    fout << cli.GetRPathLinkFlag();
    fout << this->OutputConverter->EscapeForShell(rpath_link,
                                                  !this->ForResponse);
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  std::string remainingLibs = fout.str();
  if (!remainingLibs.empty()) {
    linkLibraries.emplace_back(remainingLibs);
  }
}